

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

void WindowDropCallback(GLFWwindow *window,int count,char **paths)

{
  char *pcVar1;
  int local_24;
  int i;
  char **paths_local;
  int count_local;
  GLFWwindow *window_local;
  
  ClearDroppedFiles();
  CORE.Window.dropFilesPath = (char **)malloc((long)count << 3);
  for (local_24 = 0; local_24 < count; local_24 = local_24 + 1) {
    pcVar1 = (char *)malloc(0x1000);
    CORE.Window.dropFilesPath[local_24] = pcVar1;
    strcpy(CORE.Window.dropFilesPath[local_24],paths[local_24]);
  }
  CORE.Window.dropFilesCount = count;
  return;
}

Assistant:

static void WindowDropCallback(GLFWwindow *window, int count, const char **paths)
{
    ClearDroppedFiles();

    CORE.Window.dropFilesPath = (char **)RL_MALLOC(sizeof(char *)*count);

    for (int i = 0; i < count; i++)
    {
        CORE.Window.dropFilesPath[i] = (char *)RL_MALLOC(sizeof(char)*MAX_FILEPATH_LENGTH);
        strcpy(CORE.Window.dropFilesPath[i], paths[i]);
    }

    CORE.Window.dropFilesCount = count;
}